

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O3

string * __thiscall
rtosc::MidiMappernRT::getMappedString
          (string *__return_storage_ptr__,MidiMappernRT *this,string *addr)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  stringstream out;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_1e0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
                  *)this,addr);
  p_Var1 = &(this->inv_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
    local_1e0.first._M_dataplus._M_p = (pointer)&local_1e0.first.field_2;
    pcVar3 = (addr->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,pcVar3,pcVar3 + addr->_M_string_length);
    local_1e0.second = true;
    bVar4 = has2<std::deque<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>,std::pair<std::__cxx11::string,bool>>
                      (&this->learnQueue,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.first._M_dataplus._M_p != &local_1e0.first.field_2) {
      operator_delete(local_1e0.first._M_dataplus._M_p,
                      local_1e0.first.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      local_1e0.first._M_dataplus._M_p = (pointer)&local_1e0.first.field_2;
      pcVar3 = (addr->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,pcVar3,pcVar3 + addr->_M_string_length);
      local_1e0.second = true;
      iVar5 = getInd<std::deque<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>,std::pair<std::__cxx11::string,bool>>
                        (&this->learnQueue,&local_1e0);
      std::ostream::operator<<(local_1a8,iVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.first._M_dataplus._M_p != &local_1e0.first.field_2) {
        operator_delete(local_1e0.first._M_dataplus._M_p,
                        local_1e0.first.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
             ::operator[](&this->inv_map,addr);
    if ((pmVar7->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
        super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.super__Head_base<1UL,_int,_false>.
        _M_head_impl != -1) {
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
               ::operator[](&this->inv_map,addr);
      std::ostream::operator<<
                (local_1a8,
                 (pmVar7->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
                 super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.
                 super__Head_base<1UL,_int,_false>._M_head_impl);
    }
  }
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
                  *)this,addr);
  if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
    paVar2 = &local_1e0.first.field_2;
    pcVar3 = (addr->_M_dataplus)._M_p;
    local_1e0.first._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,pcVar3,pcVar3 + addr->_M_string_length);
    local_1e0.second = false;
    bVar4 = has2<std::deque<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>,std::pair<std::__cxx11::string,bool>>
                      (&this->learnQueue,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e0.first._M_dataplus._M_p,
                      local_1e0.first.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      pcVar3 = (addr->_M_dataplus)._M_p;
      local_1e0.first._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,pcVar3,pcVar3 + addr->_M_string_length);
      local_1e0.second = false;
      iVar5 = getInd<std::deque<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>,std::pair<std::__cxx11::string,bool>>
                        (&this->learnQueue,&local_1e0);
      std::ostream::operator<<(local_1a8,iVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_1e0.first._M_dataplus._M_p,
                        local_1e0.first.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
             ::operator[](&this->inv_map,addr);
    if ((pmVar7->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
        super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.
        super__Tuple_impl<2UL,_int,_rtosc::MidiBijection>.super__Head_base<2UL,_int,_false>.
        _M_head_impl != -1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
               ::operator[](&this->inv_map,addr);
      std::ostream::operator<<
                (local_1a8,
                 (pmVar7->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
                 super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.
                 super__Tuple_impl<2UL,_int,_rtosc::MidiBijection>.super__Head_base<2UL,_int,_false>
                 ._M_head_impl);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string MidiMappernRT::getMappedString(std::string addr)
{
    std::stringstream out;
    //find coarse
    if(has_t(inv_map,addr)) {
        if(std::get<1>(inv_map[addr]) != -1)
            out << std::get<1>(inv_map[addr]);
    }else if(has2(learnQueue, make_pair(addr,true)))
        out << getInd(learnQueue,std::make_pair(addr,true));
    //find Fine
    if(has_t(inv_map,addr)) {
        if(std::get<2>(inv_map[addr]) != -1)
            out << ":" << std::get<2>(inv_map[addr]);
    } else if(has2(learnQueue, make_pair(addr,false)))
        out << getInd(learnQueue,std::make_pair(addr,false));

    return out.str();
}